

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

string * __thiscall
t_php_generator::php_namespace_suffix_abi_cxx11_
          (string *__return_storage_ptr__,t_php_generator *this,t_program *p)

{
  char *__rhs;
  string ns;
  allocator local_b2;
  allocator local_b1;
  string local_b0 [8];
  long local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  php_namespace_base_abi_cxx11_(&local_70,this,p);
  if ((this->nsglobal_)._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_90,"",&local_b1);
  }
  else {
    std::__cxx11::string::string((string *)&local_90,(string *)&this->nsglobal_);
  }
  if (local_70._M_string_length == 0) {
    __rhs = "";
  }
  else {
    if ((this->nsglobal_)._M_string_length == 0) {
      std::__cxx11::string::string(local_b0,"",&local_b2);
    }
    else {
      std::__cxx11::string::string(local_b0,(string *)&this->nsglobal_);
    }
    __rhs = "\\";
    if (local_a8 == 0) {
      __rhs = "";
    }
  }
  std::operator+(&local_50,&local_90,__rhs);
  std::operator+(__return_storage_ptr__,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (local_70._M_string_length != 0) {
    std::__cxx11::string::~string(local_b0);
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

string php_namespace_suffix(const t_program* p) {
    string ns = php_namespace_base(p);

    return NSGLOBAL
      + (ns.size() && NSGLOBAL.size() ? "\\" : "")
      + ns;
  }